

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *p_v,float v_speed,void *p_min,
                        void *p_max,char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  double local_1a0;
  double local_190;
  float local_170;
  float local_168;
  unsigned_long_long local_150;
  unsigned_long_long local_140;
  longlong local_120;
  longlong local_110;
  uint local_f0;
  uint local_e8;
  int local_d0;
  int local_c8;
  ushort local_ae;
  ushort local_a6;
  short local_9e;
  short local_96;
  byte local_8d;
  byte local_85;
  char local_7d;
  char local_75;
  uint local_64;
  bool r_3;
  ImU32 v32_3;
  bool r_2;
  ImS32 v32_2;
  bool r_1;
  ImU32 v32_1;
  bool r;
  ImGuiContext *pIStack_48;
  ImS32 v32;
  ImGuiContext *g;
  char *format_local;
  void *p_max_local;
  void *p_min_local;
  double *pdStack_20;
  float v_speed_local;
  void *p_v_local;
  ImGuiID local_10;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  
  if ((flags == 1) || (bVar1 = false, (flags & 0x7000000fU) == 0)) {
    bVar1 = true;
  }
  g = (ImGuiContext *)format;
  format_local = (char *)p_max;
  p_max_local = p_min;
  p_min_local._4_4_ = v_speed;
  pdStack_20 = (double *)p_v;
  p_v_local._4_4_ = data_type;
  local_10 = id;
  if (bVar1) {
    pIStack_48 = GImGui;
    if (GImGui->ActiveId == id) {
      if ((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
         (((GImGui->IO).MouseDown[0] & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((GImGui->ActiveIdSource == ImGuiInputSource_Nav) &&
              ((GImGui->NavActivatePressedId == id && ((GImGui->ActiveIdIsJustActivated & 1U) == 0))
              )) {
        ClearActiveID();
      }
    }
    if (pIStack_48->ActiveId == local_10) {
      if ((((pIStack_48->CurrentWindow->DC).ItemFlags & 0x80U) == 0) && ((flags & 0x200000U) == 0))
      {
        switch(p_v_local._4_4_) {
        case 0:
          v32_1 = (ImU32)*(char *)pdStack_20;
          if (p_max_local == (void *)0x0) {
            local_75 = -0x80;
          }
          else {
            local_75 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_7d = '\x7f';
          }
          else {
            local_7d = *format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<int,int,float>
                         (4,(int *)&v32_1,p_min_local._4_4_,(int)local_75,(int)local_7d,
                          &g->Initialized,flags);
          if (data_type_local._3_1_) {
            *(char *)pdStack_20 = (char)v32_1;
          }
          break;
        case 1:
          v32_2 = (ImS32)*(byte *)pdStack_20;
          if (p_max_local == (void *)0x0) {
            local_85 = 0;
          }
          else {
            local_85 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_8d = 0xff;
          }
          else {
            local_8d = *format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<unsigned_int,int,float>
                         (5,(uint *)&v32_2,p_min_local._4_4_,(uint)local_85,(uint)local_8d,
                          &g->Initialized,flags);
          if (data_type_local._3_1_) {
            *(char *)pdStack_20 = (char)v32_2;
          }
          break;
        case 2:
          v32_3 = (ImU32)*(short *)pdStack_20;
          if (p_max_local == (void *)0x0) {
            local_96 = -0x8000;
          }
          else {
            local_96 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_9e = 0x7fff;
          }
          else {
            local_9e = *(short *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<int,int,float>
                         (4,(int *)&v32_3,p_min_local._4_4_,(int)local_96,(int)local_9e,
                          &g->Initialized,flags);
          if (data_type_local._3_1_) {
            *(short *)pdStack_20 = (short)v32_3;
          }
          break;
        case 3:
          local_64 = (uint)*(ushort *)pdStack_20;
          if (p_max_local == (void *)0x0) {
            local_a6 = 0;
          }
          else {
            local_a6 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_ae = 0xffff;
          }
          else {
            local_ae = *(ushort *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<unsigned_int,int,float>
                         (5,&local_64,p_min_local._4_4_,(uint)local_a6,(uint)local_ae,
                          &g->Initialized,flags);
          if (data_type_local._3_1_) {
            *(short *)pdStack_20 = (short)local_64;
          }
          break;
        case 4:
          if (p_max_local == (void *)0x0) {
            local_c8 = -0x80000000;
          }
          else {
            local_c8 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_d0 = 0x7fffffff;
          }
          else {
            local_d0 = *(int *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<int,int,float>
                         (p_v_local._4_4_,(int *)pdStack_20,p_min_local._4_4_,local_c8,local_d0,
                          &g->Initialized,flags);
          break;
        case 5:
          if (p_max_local == (void *)0x0) {
            local_e8 = 0;
          }
          else {
            local_e8 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_f0 = 0xffffffff;
          }
          else {
            local_f0 = *(uint *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<unsigned_int,int,float>
                         (p_v_local._4_4_,(uint *)pdStack_20,p_min_local._4_4_,local_e8,local_f0,
                          &g->Initialized,flags);
          break;
        case 6:
          if (p_max_local == (void *)0x0) {
            local_110 = -0x8000000000000000;
          }
          else {
            local_110 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_120 = 0x7fffffffffffffff;
          }
          else {
            local_120 = *(longlong *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<long_long,long_long,double>
                         (p_v_local._4_4_,(longlong *)pdStack_20,p_min_local._4_4_,local_110,
                          local_120,&g->Initialized,flags);
          break;
        case 7:
          if (p_max_local == (void *)0x0) {
            local_140 = 0;
          }
          else {
            local_140 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_150 = 0xffffffffffffffff;
          }
          else {
            local_150 = *(unsigned_long_long *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<unsigned_long_long,long_long,double>
                         (p_v_local._4_4_,(unsigned_long_long *)pdStack_20,p_min_local._4_4_,
                          local_140,local_150,&g->Initialized,flags);
          break;
        case 8:
          if (p_max_local == (void *)0x0) {
            local_168 = -3.4028235e+38;
          }
          else {
            local_168 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_170 = 3.4028235e+38;
          }
          else {
            local_170 = *(float *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<float,float,float>
                         (p_v_local._4_4_,(float *)pdStack_20,p_min_local._4_4_,local_168,local_170,
                          &g->Initialized,flags);
          break;
        case 9:
          if (p_max_local == (void *)0x0) {
            local_190 = -1.79769313486232e+308;
          }
          else {
            local_190 = *p_max_local;
          }
          if (format_local == (char *)0x0) {
            local_1a0 = 1.79769313486232e+308;
          }
          else {
            local_1a0 = *(double *)format_local;
          }
          data_type_local._3_1_ =
               DragBehaviorT<double,double,double>
                         (p_v_local._4_4_,pdStack_20,p_min_local._4_4_,local_190,local_1a0,
                          &g->Initialized,flags);
          break;
        case 10:
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                        ,0x8a4,
                        "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, ImGuiSliderFlags)"
                       );
        }
      }
      else {
        data_type_local._3_1_ = false;
      }
    }
    else {
      data_type_local._3_1_ = false;
    }
    return data_type_local._3_1_;
  }
  __assert_fail("(flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && \"Invalid ImGuiSliderFlags flags! Has the \'float power\' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                ,0x887,
                "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, ImGuiSliderFlags)"
               );
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* p_v, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    // Read imgui.cpp "API BREAKING CHANGES" section for 1.78 if you hit this assert.
    IM_ASSERT((flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && "Invalid ImGuiSliderFlags flags! Has the 'float power' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.");

    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;
    if ((g.CurrentWindow->DC.ItemFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:     { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS8*) p_min : IM_S8_MIN,  p_max ? *(const ImS8*)p_max  : IM_S8_MAX,  format, flags); if (r) *(ImS8*)p_v = (ImS8)v32; return r; }
    case ImGuiDataType_U8:     { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU8*) p_min : IM_U8_MIN,  p_max ? *(const ImU8*)p_max  : IM_U8_MAX,  format, flags); if (r) *(ImU8*)p_v = (ImU8)v32; return r; }
    case ImGuiDataType_S16:    { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS16*)p_min : IM_S16_MIN, p_max ? *(const ImS16*)p_max : IM_S16_MAX, format, flags); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16:    { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU16*)p_min : IM_U16_MIN, p_max ? *(const ImU16*)p_max : IM_U16_MAX, format, flags); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)p_v,  v_speed, p_min ? *(const ImS32* )p_min : IM_S32_MIN, p_max ? *(const ImS32* )p_max : IM_S32_MAX, format, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)p_v,  v_speed, p_min ? *(const ImU32* )p_min : IM_U32_MIN, p_max ? *(const ImU32* )p_max : IM_U32_MAX, format, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)p_v,  v_speed, p_min ? *(const ImS64* )p_min : IM_S64_MIN, p_max ? *(const ImS64* )p_max : IM_S64_MAX, format, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)p_v,  v_speed, p_min ? *(const ImU64* )p_min : IM_U64_MIN, p_max ? *(const ImU64* )p_max : IM_U64_MAX, format, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)p_v,  v_speed, p_min ? *(const float* )p_min : -FLT_MAX,   p_max ? *(const float* )p_max : FLT_MAX,    format, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)p_v, v_speed, p_min ? *(const double*)p_min : -DBL_MAX,   p_max ? *(const double*)p_max : DBL_MAX,    format, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}